

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.h
# Opt level: O3

void __thiscall soplex::SPxAutoPR<double>::SPxAutoPR(SPxAutoPR<double> *this,SPxAutoPR<double> *old)

{
  SPxSolverBase<double> *pSVar1;
  SPxPricer<double> *pSVar2;
  
  pSVar1 = (old->super_SPxPricer<double>).thesolver;
  (this->super_SPxPricer<double>).m_name = (old->super_SPxPricer<double>).m_name;
  (this->super_SPxPricer<double>).thesolver = pSVar1;
  (this->super_SPxPricer<double>).thetolerance = (old->super_SPxPricer<double>).thetolerance;
  (this->super_SPxPricer<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_SPxPricer<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_SPxPricer<double>).compare.elements = (IdxElement *)0x0;
  (this->super_SPxPricer<double>)._vptr_SPxPricer = (_func_int **)&PTR_getName_003b10d0;
  this->switchIters = old->switchIters;
  SPxDevexPR<double>::SPxDevexPR(&this->devex,&old->devex);
  SPxSteepPR<double>::SPxSteepPR
            (&(this->steep).super_SPxSteepPR<double>,&(old->steep).super_SPxSteepPR<double>);
  (this->steep).super_SPxSteepPR<double>.super_SPxPricer<double>._vptr_SPxPricer =
       (_func_int **)&PTR_getName_003b1368;
  pSVar2 = (SPxPricer<double> *)&this->steep;
  if ((SPxDevexPR<double> *)old->activepricer == &old->devex) {
    pSVar2 = &(this->devex).super_SPxPricer<double>;
  }
  this->activepricer = pSVar2;
  return;
}

Assistant:

SPxAutoPR(const SPxAutoPR& old)
      : SPxPricer<R>(old)
      , switchIters(old.switchIters)
      , devex(old.devex)
      , steep(old.steep)
   {
      assert(old.activepricer == &old.devex || old.activepricer == &old.steep);

      if(old.activepricer == &old.devex)
         activepricer = &devex;
      else
         activepricer = &steep;
   }